

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenFullyQualifiedNameGetter
          (CppGenerator *this,StructDef *struct_def,string *name)

{
  CodeWriter *this_00;
  string fullname;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  if ((this->opts_).super_IDLOptions.generate_name_strings == true) {
    Namespace::GetFullyQualifiedName
              (&local_28,(struct_def->super_Definition).defined_namespace,name,1000);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"NAME",(allocator<char> *)&local_a8);
    this_00 = &this->code_;
    CodeWriter::SetValue(this_00,&local_c8,&local_28);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"CONSTEXPR",&local_c9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"FLATBUFFERS_CONSTEXPR_CPP11",&local_ca);
    CodeWriter::SetValue(this_00,&local_c8,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"  static {{CONSTEXPR}} const char *GetFullyQualifiedName() {",
               (allocator<char> *)&local_c8);
    CodeWriter::operator+=(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"    return \"{{NAME}}\";",(allocator<char> *)&local_c8);
    CodeWriter::operator+=(this_00,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"  }",(allocator<char> *)&local_c8);
    CodeWriter::operator+=(this_00,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

void GenFullyQualifiedNameGetter(const StructDef &struct_def,
                                   const std::string &name) {
    if (!opts_.generate_name_strings) { return; }
    auto fullname = struct_def.defined_namespace->GetFullyQualifiedName(name);
    code_.SetValue("NAME", fullname);
    code_.SetValue("CONSTEXPR", "FLATBUFFERS_CONSTEXPR_CPP11");
    code_ += "  static {{CONSTEXPR}} const char *GetFullyQualifiedName() {";
    code_ += "    return \"{{NAME}}\";";
    code_ += "  }";
  }